

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffflus(fitsfile *fptr,int *status)

{
  uint uVar1;
  int iVar2;
  int hdunum;
  int hdutype;
  undefined8 local_18;
  
  uVar1 = *status;
  local_18 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  ffghdn(fptr,(int *)&local_18);
  iVar2 = ffchdu(fptr,status);
  if (0 < iVar2) {
    ffpmsg("ffflus could not close the current HDU.");
  }
  ffflsh(fptr,0,status);
  iVar2 = ffgext(fptr,(int)local_18 + -1,(int *)((long)&local_18 + 4),status);
  if (0 < iVar2) {
    ffpmsg("ffflus could not reopen the current HDU.");
  }
  return *status;
}

Assistant:

int ffflus(fitsfile *fptr,   /* I - FITS file pointer                       */
           int *status)      /* IO - error status                           */
/*
  Flush all the data in the current FITS file to disk. This ensures that if
  the program subsequently dies, the disk FITS file will be closed correctly.
*/
{
    int hdunum, hdutype;

    if (*status > 0)
        return(*status);

    ffghdn(fptr, &hdunum);     /* get the current HDU number */

    if (ffchdu(fptr,status) > 0)   /* close out the current HDU */
        ffpmsg("ffflus could not close the current HDU.");

    ffflsh(fptr, FALSE, status);  /* flush any modified IO buffers to disk */

    if (ffgext(fptr, hdunum - 1, &hdutype, status) > 0) /* reopen HDU */
        ffpmsg("ffflus could not reopen the current HDU.");

    return(*status);
}